

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

array_container_t * array_container_clone(array_container_t *src)

{
  int *in_RDI;
  array_container_t *newcontainer;
  undefined8 in_stack_ffffffffffffffe8;
  array_container_t *local_8;
  
  local_8 = array_container_create_given_capacity
                      ((int32_t)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  if (local_8 == (array_container_t *)0x0) {
    local_8 = (array_container_t *)0x0;
  }
  else {
    local_8->cardinality = *in_RDI;
    memcpy(local_8->array,*(void **)(in_RDI + 2),(long)*in_RDI << 1);
  }
  return local_8;
}

Assistant:

ALLOW_UNALIGNED
array_container_t *array_container_clone(const array_container_t *src) {
    array_container_t *newcontainer =
        array_container_create_given_capacity(src->capacity);
    if (newcontainer == NULL) return NULL;

    newcontainer->cardinality = src->cardinality;

    memcpy(newcontainer->array, src->array,
           src->cardinality * sizeof(uint16_t));

    return newcontainer;
}